

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O0

void icu_63::number::impl::blueprint_helpers::parseCurrencyOption
               (StringSegment *segment,MacroProps *macros,UErrorCode *status)

{
  UBool UVar1;
  int32_t iVar2;
  char16_t *p;
  ConstChar16Ptr local_a0;
  undefined1 local_98 [8];
  CurrencyUnit currency;
  UErrorCode localStatus;
  UnicodeString local_68;
  char16_t *local_28;
  UChar *currencyCode;
  UErrorCode *status_local;
  MacroProps *macros_local;
  StringSegment *segment_local;
  
  currencyCode = (UChar *)status;
  status_local = (UErrorCode *)macros;
  macros_local = (MacroProps *)segment;
  iVar2 = numparse::impl::StringSegment::length(segment);
  if (iVar2 == 3) {
    numparse::impl::StringSegment::toTempUnicodeString(&local_68,(StringSegment *)macros_local);
    p = icu_63::UnicodeString::getBuffer(&local_68);
    icu_63::UnicodeString::~UnicodeString(&local_68);
    currency._24_4_ = 0;
    local_28 = p;
    ConstChar16Ptr::ConstChar16Ptr(&local_a0,p);
    CurrencyUnit::CurrencyUnit
              ((CurrencyUnit *)local_98,&local_a0,(UErrorCode *)&currency.field_0x18);
    ConstChar16Ptr::~ConstChar16Ptr(&local_a0);
    UVar1 = ::U_FAILURE(currency._24_4_);
    if (UVar1 == '\0') {
      MeasureUnit::operator=((MeasureUnit *)(status_local + 4),(MeasureUnit *)local_98);
    }
    else {
      currencyCode[0] = L'ē';
      currencyCode[1] = L'\x01';
    }
    CurrencyUnit::~CurrencyUnit((CurrencyUnit *)local_98);
  }
  else {
    currencyCode[0] = L'ē';
    currencyCode[1] = L'\x01';
  }
  return;
}

Assistant:

void blueprint_helpers::parseCurrencyOption(const StringSegment& segment, MacroProps& macros,
                                            UErrorCode& status) {
    // Unlike ICU4J, have to check length manually because ICU4C CurrencyUnit does not check it for us
    if (segment.length() != 3) {
        status = U_NUMBER_SKELETON_SYNTAX_ERROR;
        return;
    }
    const UChar* currencyCode = segment.toTempUnicodeString().getBuffer();
    UErrorCode localStatus = U_ZERO_ERROR;
    CurrencyUnit currency(currencyCode, localStatus);
    if (U_FAILURE(localStatus)) {
        // Not 3 ascii chars
        // throw new SkeletonSyntaxException("Invalid currency", segment);
        status = U_NUMBER_SKELETON_SYNTAX_ERROR;
        return;
    }
    // Slicing is OK
    macros.unit = currency; // NOLINT
}